

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall
dmlc::JSONObjectReadHelper::
DeclareFieldInternal<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
          (JSONObjectReadHelper *this,string *key,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
          *addr,bool optional)

{
  undefined1 uVar1;
  bool bVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  Entry e;
  LogMessageFatal local_1c8;
  uint local_3c;
  size_type local_38;
  LogCheckError local_30;
  LogCheckError _check_err;
  bool optional_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
  *addr_local;
  string *key_local;
  JSONObjectReadHelper *this_local;
  
  _check_err.str._7_1_ = optional;
  local_38 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
             ::count(&this->map_,key);
  local_3c = 0;
  LogCheck_EQ<unsigned_long,unsigned_int>((dmlc *)&local_30,&local_38,&local_3c);
  bVar2 = LogCheckError::operator_cast_to_bool(&local_30);
  if (bVar2) {
    LogMessageFatal::LogMessageFatal
              (&local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x3ee);
    poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_1c8);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"map_.count(key) == 0U");
    poVar4 = std::operator<<(poVar4,(string *)local_30.str);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Adding duplicate field ");
    std::operator<<(poVar4,(string *)key);
    LogMessageFatal::~LogMessageFatal(&local_1c8);
  }
  LogCheckError::~LogCheckError(&local_30);
  uVar1 = _check_err.str._7_1_;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dmlc::JSONObjectReadHelper::Entry>_>_>
           ::operator[](&this->map_,key);
  pmVar5->func = 
  ReaderFunction<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
  ;
  pmVar5->addr = addr;
  *(ulong *)&pmVar5->optional = CONCAT71(e.addr._1_7_,uVar1) & 0xffffffffffffff01;
  return;
}

Assistant:

inline void JSONObjectReadHelper::
    DeclareFieldInternal(const std::string &key, T *addr, bool optional) {
  CHECK_EQ(map_.count(key), 0U)
      << "Adding duplicate field " << key;
  Entry e;
  e.func = ReaderFunction<T>;
  e.addr = static_cast<void *>(addr);
  e.optional = optional;
  map_[key] = e;
}